

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gkc.c
# Opt level: O0

void gkc_summary_free(gkc_summary *s)

{
  list *plVar1;
  void *p;
  list *next;
  list *cur;
  freelist *fl;
  gkc_summary *s_local;
  
  next = (s->head).next;
  while (next != &s->head) {
    plVar1 = next->next;
    gkc_free(s,(gkc_tuple *)&next[-2].next);
    next = plVar1;
  }
  cur = (list *)s->fl;
  while (cur != (list *)0x0) {
    plVar1 = cur->prev;
    free(cur);
    cur = plVar1;
  }
  free(s);
  return;
}

Assistant:

void gkc_summary_free(struct gkc_summary *s)
{
    struct freelist *fl;
    struct list *cur;

    cur = s->head.next;
    while (cur != &s->head) {
        struct list *next;
        next = cur->next;
        gkc_free(s, list_to_tuple(cur));
        cur = next;
    }
    fl = s->fl;
    while (fl) {
        void *p;
        p = fl;
        fl = fl->next;
        free(p);
    }
    free(s);
}